

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_hc::determine_alpha_endpoint_clusters_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  vector_vec_type *this_00;
  tile_details *ptVar5;
  vec<2U,_float> *this_01;
  vec<2U,_float> *pvVar6;
  tree_clusterizer<crnlib::vec<2U,_float>_> *in_RDX;
  long in_RSI;
  vector<crnlib::dxt_hc::tile_details> *in_RDI;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float dist;
  uint i;
  uint best_index;
  float best_dist;
  vec2F *v;
  uint a;
  uint tEnd;
  uint t;
  uint num_tasks;
  vector<crnlib::vec<2U,_float>_> *codebook;
  tree_clusterizer<crnlib::vec<2U,_float>_> *vq;
  uint local_4c;
  uint local_48;
  float local_44;
  uint local_38;
  uint local_30;
  
  this_00 = tree_clusterizer<crnlib::vec<2U,_float>_>::get_codebook(in_RDX);
  uVar2 = task_pool::get_num_threads(*(task_pool **)&in_RDI[0x89].m_size);
  uVar3 = vector<crnlib::dxt_hc::tile_details>::size(in_RDI);
  local_30 = (uint)(((ulong)uVar3 * in_RSI) / (ulong)(uVar2 + 1));
  uVar3 = vector<crnlib::dxt_hc::tile_details>::size(in_RDI);
  do {
    if ((uint)(((ulong)uVar3 * (in_RSI + 1)) / (ulong)(uVar2 + 1)) <= local_30) {
      return;
    }
    ptVar5 = vector<crnlib::dxt_hc::tile_details>::operator[](in_RDI,local_30);
    uVar4 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&ptVar5->pixels);
    if (uVar4 != 0) {
      for (local_38 = 0; local_38 < *(uint *)&in_RDI[0x86].m_p; local_38 = local_38 + 1) {
        ptVar5 = vector<crnlib::dxt_hc::tile_details>::operator[](in_RDI,local_30);
        this_01 = ptVar5->alpha_endpoints + local_38;
        local_44 = 1e+37;
        local_48 = 0;
        local_4c = 0;
        while( true ) {
          uVar4 = vector<crnlib::vec<2U,_float>_>::size(this_00);
          if (uVar4 <= local_4c) break;
          pvVar6 = vector<crnlib::vec<2U,_float>_>::operator[](this_00,local_4c);
          fVar7 = vec<2U,_float>::operator[](pvVar6,0);
          fVar8 = vec<2U,_float>::operator[](this_01,0);
          pvVar6 = vector<crnlib::vec<2U,_float>_>::operator[](this_00,local_4c);
          fVar9 = vec<2U,_float>::operator[](pvVar6,0);
          fVar10 = vec<2U,_float>::operator[](this_01,0);
          pvVar6 = vector<crnlib::vec<2U,_float>_>::operator[](this_00,local_4c);
          fVar11 = vec<2U,_float>::operator[](pvVar6,1);
          fVar12 = vec<2U,_float>::operator[](this_01,1);
          pvVar6 = vector<crnlib::vec<2U,_float>_>::operator[](this_00,local_4c);
          fVar13 = vec<2U,_float>::operator[](pvVar6,1);
          fVar14 = vec<2U,_float>::operator[](this_01,1);
          fVar7 = (fVar7 - fVar8) * (fVar9 - fVar10) + (fVar11 - fVar12) * (fVar13 - fVar14);
          uVar1 = local_48;
          if (fVar7 < local_44) {
            local_48 = local_4c;
            uVar1 = local_48;
            local_48._0_2_ = (uint16)local_4c;
            local_44 = fVar7;
            if ((fVar7 == 0.0) && (!NAN(fVar7))) break;
          }
          local_48 = uVar1;
          local_4c = local_4c + 1;
        }
        ptVar5 = vector<crnlib::dxt_hc::tile_details>::operator[](in_RDI,local_30);
        ptVar5->cluster_indices[local_38 + 1] = (uint16)local_48;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void dxt_hc::determine_alpha_endpoint_clusters_task(uint64 data, void* pData_ptr) {
  tree_clusterizer<vec2F>* vq = (tree_clusterizer<vec2F>*)pData_ptr;
  const crnlib::vector<vec2F>& codebook = vq->get_codebook();
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  for (uint t = m_tiles.size() * data / num_tasks, tEnd = m_tiles.size() * (data + 1) / num_tasks; t < tEnd; t++) {
    if (m_tiles[t].pixels.size()) {
      for (uint a = 0; a < m_num_alpha_blocks; a++) {
        const vec2F& v = m_tiles[t].alpha_endpoints[a];
        float best_dist = math::cNearlyInfinite;
        uint best_index = 0;
        for (uint i = 0; i < codebook.size(); i++) {
          float dist = (codebook[i][0] - v[0]) * (codebook[i][0] - v[0]) + (codebook[i][1] - v[1]) * (codebook[i][1] - v[1]);
          if (dist < best_dist) {
            best_dist = dist;
            best_index = i;
            if (best_dist == 0.0f)
              break;
          }
        }
        m_tiles[t].cluster_indices[cAlpha0 + a] = best_index;
      }
    }
  }
}